

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O0

ssize_t SAFEREAD(int f,uchar *b,int c)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ssize_t res;
  int c_local;
  uchar *b_local;
  int f_local;
  
  do {
    sVar1 = read(f,b,(long)c);
    if (-1 < sVar1) {
      return sVar1;
    }
    piVar2 = __errno_location();
    bVar3 = true;
    if (*piVar2 != 4) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 0xb;
    }
  } while (bVar3);
  perror("reading UnixPipeIn");
  return sVar1;
}

Assistant:

static inline ssize_t SAFEREAD(int f, unsigned char *b, int c) {
  ssize_t res;
  do {
    res = read(f, b, c);
    if (res >= 0) return (res);
  } while (errno == EINTR || errno == EAGAIN);
  perror("reading UnixPipeIn");
  return (res);
}